

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O2

bool __thiscall SQInstance::GetMetaMethod(SQInstance *this,SQVM *v,SQMetaMethod mm,SQObjectPtr *res)

{
  SQObjectType SVar1;
  
  SVar1 = this->_class->_metamethods[mm].super_SQObject._type;
  if (SVar1 != OT_NULL) {
    SQObjectPtr::operator=(res,this->_class->_metamethods + mm);
  }
  return SVar1 != OT_NULL;
}

Assistant:

bool SQInstance::GetMetaMethod(SQVM* SQ_UNUSED_ARG(v),SQMetaMethod mm,SQObjectPtr &res)
{
    if(sq_type(_class->_metamethods[mm]) != OT_NULL) {
        res = _class->_metamethods[mm];
        return true;
    }
    return false;
}